

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::State::reset(State *this,char *file,size_t node_id_)

{
  csubstr cVar1;
  
  this->flags = 3;
  this->level = 0;
  cVar1 = to_csubstr(file);
  (this->pos).name = cVar1;
  (this->pos).super_LineCol.line = 1;
  (this->pos).super_LineCol.col = 1;
  this->node_id = node_id_;
  this->indref = 0;
  (this->scalar).str = (char *)0x0;
  (this->scalar).len = 0;
  this->scalar_col = 0;
  (this->pos).super_LineCol.offset = 0;
  return;
}

Assistant:

void reset(const char *file, size_t node_id_)
        {
            flags = RUNK|RTOP;
            level = 0;
            pos.name = to_csubstr(file);
            pos.offset = 0;
            pos.line = 1;
            pos.col = 1;
            node_id = node_id_;
            scalar_col = 0;
            scalar.clear();
            indref = 0;
        }